

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_list.cpp
# Opt level: O0

void __thiscall ImageList::ImageList(ImageList *this,QSize maxImageSize,QWidget *parent)

{
  ImageListPrivate *this_00;
  ImageListPrivate *this_01;
  QWidget *parent_local;
  ImageList *this_local;
  QSize maxImageSize_local;
  
  this_local = (ImageList *)maxImageSize;
  QtMWidgets::AbstractListView<QImage>::AbstractListView
            (&this->super_AbstractListView<QImage>,parent);
  *(undefined ***)
   &(this->super_AbstractListView<QImage>).super_AbstractListViewBase.super_AbstractScrollArea =
       &PTR_metaObject_00256a68;
  *(undefined ***)
   &(this->super_AbstractListView<QImage>).super_AbstractListViewBase.super_AbstractScrollArea.
    field_0x10 = &PTR__ImageList_00256c78;
  this_00 = (ImageListPrivate *)operator_new(0x18);
  ImageListPrivate::ImageListPrivate(this_00,(QSize *)&this_local,this);
  QScopedPointer<ImageListPrivate,_QScopedPointerDeleter<ImageListPrivate>_>::QScopedPointer
            (&this->d,this_00);
  this_01 = QScopedPointer<ImageListPrivate,_QScopedPointerDeleter<ImageListPrivate>_>::operator->
                      (&this->d);
  ImageListPrivate::init(this_01,(EVP_PKEY_CTX *)this_00);
  return;
}

Assistant:

ImageList::ImageList( const QSize maxImageSize, QWidget * parent )
	:	QtMWidgets::AbstractListView< QImage > ( parent )
	,	d( new ImageListPrivate( maxImageSize, this ) )
{
	d->init();
}